

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O1

void __thiscall ON_GeometryValue::~ON_GeometryValue(ON_GeometryValue *this)

{
  ON_Geometry **ppOVar1;
  ON_Geometry *pOVar2;
  long lVar3;
  long lVar4;
  
  (this->super_ON_Value)._vptr_ON_Value = (_func_int **)&PTR__ON_GeometryValue_008257e0;
  lVar3 = (long)(this->m_value).m_count;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      ppOVar1 = (this->m_value).m_a;
      pOVar2 = ppOVar1[lVar4];
      ppOVar1[lVar4] = (ON_Geometry *)0x0;
      if (pOVar2 != (ON_Geometry *)0x0) {
        (*(pOVar2->super_ON_Object)._vptr_ON_Object[4])();
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&this->m_value);
  return;
}

Assistant:

ON_GeometryValue::~ON_GeometryValue()
{
  int i, count = m_value.Count();
  for ( i = 0; i < count; i++ )
  {
    ON_Geometry* p = m_value[i];
    m_value[i] = 0;
    if (p)
    {
      delete p;
    }
  }
}